

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixDelete(sqlite3_vfs *NotUsed,char *zPath,int dirSync)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  long in_FS_OFFSET;
  int fd;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (*aSyscall[0x10].pCurrent)(zPath);
  if (iVar2 == -1) {
    piVar4 = __errno_location();
    iVar2 = 0x170a;
    if (*piVar4 != 2) {
      iVar2 = 0xa0a;
      unixLogErrorAtLine(0xa0a,"unlink",zPath,0xb04d);
    }
  }
  else {
    iVar2 = 0;
    if ((dirSync & 1U) != 0) {
      iVar3 = (*aSyscall[0x11].pCurrent)(zPath);
      iVar2 = 0;
      if (iVar3 == 0) {
        iVar2 = fsync(-0x55555556);
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          iVar2 = 0x50a;
          unixLogErrorAtLine(0x50a,"fsync",zPath,0xb057);
        }
        robust_close((unixFile *)0x0,-0x55555556,0xb059);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

static int unixDelete(
  sqlite3_vfs *NotUsed,     /* VFS containing this as the xDelete method */
  const char *zPath,        /* Name of file to be deleted */
  int dirSync               /* If true, fsync() directory after deleting file */
){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(NotUsed);
  SimulateIOError(return SQLITE_IOERR_DELETE);
  if( osUnlink(zPath)==(-1) ){
    if( errno==ENOENT
#if OS_VXWORKS
        || osAccess(zPath,0)!=0
#endif
    ){
      rc = SQLITE_IOERR_DELETE_NOENT;
    }else{
      rc = unixLogError(SQLITE_IOERR_DELETE, "unlink", zPath);
    }
    return rc;
  }
#ifndef SQLITE_DISABLE_DIRSYNC
  if( (dirSync & 1)!=0 ){
    int fd;
    rc = osOpenDirectory(zPath, &fd);
    if( rc==SQLITE_OK ){
      if( full_fsync(fd,0,0) ){
        rc = unixLogError(SQLITE_IOERR_DIR_FSYNC, "fsync", zPath);
      }
      robust_close(0, fd, __LINE__);
    }else{
      assert( rc==SQLITE_CANTOPEN );
      rc = SQLITE_OK;
    }
  }
#endif
  return rc;
}